

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O0

void __thiscall Volume::simplePreVisualize(Volume *this,Mat *src,Point *obs)

{
  bool bVar1;
  Scalar_<double> *this_00;
  Point_<int> *a;
  Point_<int> *in_RDX;
  allocator<char> *in_RSI;
  long in_RDI;
  Point *in_stack_00000110;
  Mat *in_stack_00000118;
  char str [8];
  Object *obj;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Object,_std::allocator<Object>_> *__range1;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  Mat *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  allocator<char> *in_stack_fffffffffffffed0;
  size_type *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  _InputArray local_110;
  allocator<char> local_f1;
  string local_f0 [32];
  undefined1 local_d0 [36];
  Point_<int> local_ac;
  Point_<int> local_a4;
  undefined1 local_9c [27];
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  __normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_> local_28;
  long local_20;
  Point_<int> *local_18;
  allocator<char> *local_10;
  
  local_20 = in_RDI + 0x20;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28._M_current =
       (Object *)
       std::vector<Object,_std::allocator<Object>_>::begin
                 ((vector<Object,_std::allocator<Object>_> *)
                  CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_48.field_2._8_8_ =
       std::vector<Object,_std::allocator<Object>_>::end
                 ((vector<Object,_std::allocator<Object>_> *)
                  CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>
                        *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (!bVar1) break;
    local_48.field_2._M_allocated_capacity =
         (size_type)
         __gnu_cxx::__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>
         ::operator*(&local_28);
    in_stack_fffffffffffffed8 = &local_48._M_string_length;
    in_stack_fffffffffffffed0 = local_10;
    cv::Point_<int>::Point_((Point_<int> *)in_stack_fffffffffffffed8,local_18);
    Object::visualizeEdges((Object *)str,in_stack_00000118,in_stack_00000110);
    in_stack_fffffffffffffee0 = &local_48;
    snprintf((char *)in_stack_fffffffffffffee0,8,"%d",
             (ulong)*(uint *)local_48.field_2._M_allocated_capacity);
    cv::_InputOutputArray::_InputOutputArray
              ((_InputOutputArray *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    std::vector<Edge,_std::allocator<Edge>_>::front
              ((vector<Edge,_std::allocator<Edge>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    this_00 = (Scalar_<double> *)
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x15bff3);
    in_stack_fffffffffffffeb4 = (int)(this_00->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0]
    ;
    std::vector<Edge,_std::allocator<Edge>_>::front
              ((vector<Edge,_std::allocator<Edge>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    a = (Point_<int> *)
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x15c028);
    cv::Point_<int>::Point_(&local_a4,in_stack_fffffffffffffeb4,(int)(double)*a);
    cv::Point_<int>::Point_(&local_ac,10,10);
    cv::operator+(a,(Point_<int> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    cv::Scalar_<double>::Scalar_
              (this_00,(double)a,
               (double)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (double)in_stack_fffffffffffffea8,
               (double)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    in_stack_fffffffffffffea0 = 0;
    in_stack_fffffffffffffe98 = 8;
    cv::putText(0x3ff8000000000000,local_60,local_80,local_9c,1,local_d0);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x15c10f);
    __gnu_cxx::__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>::
    operator++(&local_28);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  cv::_InputArray::_InputArray
            ((_InputArray *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  cv::imshow(local_f0,&local_110);
  cv::_InputArray::~_InputArray(&local_110);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  cv::waitKey(0);
  return;
}

Assistant:

void Volume::simplePreVisualize(cv::Mat& src, const cv::Point& obs) const {
    for (const Object& obj: objs) {
        obj.visualizeEdges(src, obs);
        char str[8];
        snprintf(str, 8, "%d", obj.id);
		cv::putText(src, str, cv::Point(obj.edges.front().back().x(), obj.edges.front().back().y()) + cv::Point(10, 10),
				cv::FONT_HERSHEY_PLAIN, 1.5, cv::Scalar(0, 255, 255));
    }
    cv::imshow("tmp", src);
    cv::waitKey(0);
}